

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void finalize_preconditioner<dense_parameters>
               (vw *param_1,bfgs *b,float regularization,dense_parameters *weights)

{
  float fVar1;
  long lVar2;
  bool bVar3;
  uint32_t uVar4;
  float *pfVar5;
  int __c;
  dense_parameters *in_RDX;
  long in_RSI;
  dense_iterator<float> *rhs;
  float in_XMM0_Da;
  iterator w_2;
  float max_precond;
  iterator w_1;
  iterator w;
  float max_hessian;
  float local_e8;
  dense_parameters *in_stack_ffffffffffffff20;
  dense_iterator<float> local_c0;
  dense_iterator<float> local_a8;
  float local_8c;
  dense_iterator<float> local_88;
  dense_iterator<float> local_70;
  dense_iterator<float> local_58;
  dense_iterator<float> local_40;
  float local_24;
  dense_parameters *local_20;
  float local_14;
  long local_10;
  
  local_24 = 0.0;
  if (*(long *)(in_RSI + 0xd8) == 0) {
    local_14 = in_XMM0_Da;
    dense_parameters::begin(in_stack_ffffffffffffff20);
    while( true ) {
      dense_parameters::end(in_stack_ffffffffffffff20);
      bVar3 = dense_iterator<float>::operator!=(&local_40,&local_58);
      fVar1 = local_14;
      if (!bVar3) break;
      pfVar5 = dense_iterator<float>::operator*(&local_40);
      pfVar5[3] = fVar1 + pfVar5[3];
      pfVar5 = dense_iterator<float>::operator*(&local_40);
      if (local_24 < pfVar5[3]) {
        pfVar5 = dense_iterator<float>::operator*(&local_40);
        local_24 = pfVar5[3];
      }
      pfVar5 = dense_iterator<float>::operator*(&local_40);
      if (0.0 < pfVar5[3]) {
        pfVar5 = dense_iterator<float>::operator*(&local_40);
        fVar1 = pfVar5[3];
        pfVar5 = dense_iterator<float>::operator*(&local_40);
        pfVar5[3] = 1.0 / fVar1;
      }
      dense_iterator<float>::operator++(&local_40);
    }
  }
  else {
    local_20 = in_RDX;
    local_10 = in_RSI;
    dense_parameters::begin(in_stack_ffffffffffffff20);
    while( true ) {
      dense_parameters::end(in_stack_ffffffffffffff20);
      rhs = &local_88;
      bVar3 = dense_iterator<float>::operator!=(&local_70,rhs);
      if (!bVar3) break;
      lVar2 = *(long *)(local_10 + 0xd8);
      in_stack_ffffffffffffff20 =
           (dense_parameters *)dense_iterator<float>::index(&local_70,(char *)rhs,__c);
      uVar4 = dense_parameters::stride_shift(local_20);
      fVar1 = *(float *)(lVar2 + ((ulong)in_stack_ffffffffffffff20 >> ((byte)uVar4 & 0x3f)) * 8);
      pfVar5 = dense_iterator<float>::operator*(&local_70);
      pfVar5[3] = fVar1 + pfVar5[3];
      pfVar5 = dense_iterator<float>::operator*(&local_70);
      if (local_24 < pfVar5[3]) {
        pfVar5 = dense_iterator<float>::operator*(&local_70);
        local_24 = pfVar5[3];
      }
      pfVar5 = dense_iterator<float>::operator*(&local_70);
      if (0.0 < pfVar5[3]) {
        pfVar5 = dense_iterator<float>::operator*(&local_70);
        fVar1 = pfVar5[3];
        pfVar5 = dense_iterator<float>::operator*(&local_70);
        pfVar5[3] = 1.0 / fVar1;
      }
      dense_iterator<float>::operator++(&local_70);
    }
  }
  if ((local_24 != 0.0) || (NAN(local_24))) {
    local_e8 = 10000.0 / local_24;
  }
  else {
    local_e8 = 0.0;
  }
  local_8c = local_e8;
  dense_parameters::begin(in_stack_ffffffffffffff20);
  while( true ) {
    dense_parameters::end(in_stack_ffffffffffffff20);
    bVar3 = dense_iterator<float>::operator!=(&local_a8,&local_c0);
    if (!bVar3) break;
    dense_iterator<float>::operator*(&local_a8);
    bVar3 = infpattern(0.0);
    if ((bVar3) || (pfVar5 = dense_iterator<float>::operator*(&local_a8), local_8c < *pfVar5)) {
      fVar1 = local_8c;
      pfVar5 = dense_iterator<float>::operator*(&local_a8);
      pfVar5[3] = fVar1;
    }
    dense_iterator<float>::operator++(&local_a8);
  }
  return;
}

Assistant:

void finalize_preconditioner(vw& /* all */, bfgs& b, float regularization, T& weights)
{
  float max_hessian = 0.f;

  if (b.regularizers == nullptr)
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_COND] += regularization;
      if ((&(*w))[W_COND] > max_hessian)
        max_hessian = (&(*w))[W_COND];
      if ((&(*w))[W_COND] > 0)
        (&(*w))[W_COND] = 1.f / (&(*w))[W_COND];
    }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_COND] += b.regularizers[2 * (w.index() >> weights.stride_shift())];
      if ((&(*w))[W_COND] > max_hessian)
        max_hessian = (&(*w))[W_COND];
      if ((&(*w))[W_COND] > 0)
        (&(*w))[W_COND] = 1.f / (&(*w))[W_COND];
    }

  float max_precond = (max_hessian == 0.f) ? 0.f : max_precond_ratio / max_hessian;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    if (infpattern(*w) || *w > max_precond)
      (&(*w))[W_COND] = max_precond;
  }
}